

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_set.c
# Opt level: O3

int mpt_config_set(mpt_config *conf,char *path,char *val,int sep,int end)

{
  undefined8 uVar1;
  int iVar2;
  mpt_metatype *pmVar3;
  mpt_path where;
  mpt_value d;
  mpt_config *local_68;
  char *local_60;
  mpt_path local_58;
  mpt_value local_38;
  
  local_58.len = 0;
  local_58.first = '\0';
  local_58.flags = '\0';
  local_58.sep = '.';
  local_58.assign = '\0';
  local_58._28_4_ = 0;
  local_58.base = (char *)0x0;
  local_58.off = 0;
  local_68 = conf;
  local_60 = val;
  if (conf == (mpt_config *)0x0) {
    pmVar3 = mpt_config_global((mpt_path *)0x0);
    if (pmVar3 == (mpt_metatype *)0x0) {
      return -4;
    }
    iVar2 = (*(pmVar3->_vptr->convertable).convert)((mpt_convertable *)pmVar3,0x85,&local_68);
    if (iVar2 < 0) {
      return -4;
    }
    if (local_68 == (mpt_config *)0x0) {
      return -4;
    }
  }
  uVar1 = local_58._24_8_;
  if (path != (char *)0x0) {
    local_58.sep = (char)sep;
    local_58._28_4_ = SUB84(uVar1,4);
    local_58.assign = (char)end;
    mpt_path_set(&local_58,path,-1);
  }
  if (val == (char *)0x0) {
    iVar2 = (*local_68->_vptr->remove)(local_68,&local_58);
  }
  else {
    local_38._addr = &local_60;
    local_38._type = 0x73;
    iVar2 = (*local_68->_vptr->assign)(local_68,&local_58,&local_38);
  }
  return iVar2;
}

Assistant:

extern int mpt_config_set(MPT_INTERFACE(config) *conf, const char *path, const char *val, int sep, int end)
{
	MPT_STRUCT(path) where = MPT_PATH_INIT;
	
	if (!conf) {
		MPT_INTERFACE(metatype) *gl;
		if (!(gl = mpt_config_global(0))
		    || MPT_metatype_convert(gl, MPT_ENUM(TypeConfigPtr), &conf) < 0
		    || !conf) {
			return MPT_ERROR(BadOperation);
		}
	}
	if (path) {
		where.sep = sep;
		where.assign = end;
		(void) mpt_path_set(&where, path, -1);
	}
	if (!val) {
		return conf->_vptr->remove(conf, &where);
	}
	else {
		MPT_STRUCT(value) d = MPT_VALUE_INIT('s', &val);
		return conf->_vptr->assign(conf, &where, &d);
	}
}